

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  unsigned_long_long *key;
  int iVar1;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_01;
  ulong uVar4;
  ulong uVar5;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int local_68c;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  long tmpv [100];
  unsigned_long_long tmpk [100];
  node *pnVar2;
  undefined4 extraout_var_00;
  
  uVar5 = value->first;
  lVar7 = value->second;
  lVar12 = (long)this->depth;
  if (lVar12 == 0) {
    iVar1 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
    this->root = extraout_RDX;
    this->depth = 1;
    *(undefined4 *)(plVar3 + 200) = 1;
    plVar3[0x65] = uVar5;
    *plVar3 = lVar7;
    plVar3[100] = -1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
  }
  else {
    uVar4 = lVar12 << 2;
    uVar10 = lVar12 * 8;
    if (this->depth < 0) {
      uVar4 = 0xffffffffffffffff;
      uVar10 = 0xffffffffffffffff;
    }
    pos = (locType *)operator_new__(uVar10);
    *pos = 0;
    p = (node **)operator_new__(uVar10);
    pp = (int *)operator_new__(uVar4);
    *pos = this->root;
    lVar6 = 0;
    while( true ) {
      lVar8 = (long)(int)lVar12;
      if (lVar8 <= lVar6) break;
      iVar1 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + lVar6);
      pnVar2 = (node *)CONCAT44(extraout_var,iVar1);
      p[lVar6] = pnVar2;
      uVar11 = pnVar2->sz;
      if (pnVar2->sz < 1) {
        uVar11 = 0;
      }
      uVar10 = (ulong)uVar11;
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar5 <= pnVar2->keyvalue[uVar4]) {
          lVar12 = (long)this->depth;
          if (lVar12 + -1 <= lVar6) {
            uVar10 = uVar4 & 0xffffffff;
            goto LAB_0010733d;
          }
          uVar10 = (ulong)(((int)uVar4 + 1) - (uint)(uVar5 < pnVar2->keyvalue[uVar4]));
          goto LAB_0010732d;
        }
      }
      lVar12 = (long)this->depth;
      if (lVar6 < lVar12 + -1) {
LAB_0010732d:
        (pos + lVar6)[1] = (pnVar2->field_0).val[(int)uVar10];
      }
LAB_0010733d:
      pp[lVar6] = (int)uVar10;
      lVar6 = lVar6 + 1;
    }
    pnVar2 = p[lVar8 + -1];
    iVar1 = pnVar2->sz;
    iVar9 = (int)uVar10;
    if ((iVar9 < iVar1) && (pnVar2->keyvalue[iVar9] <= uVar5)) {
      operator_delete__(p);
      operator_delete__(pp);
      operator_delete__(pos);
      return false;
    }
    if (iVar9 == 0) {
      for (uVar11 = (int)lVar12 - 2; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
        lVar12 = (long)pp[uVar11];
        if ((lVar12 != 0) && (p[uVar11]->keyvalue[lVar12 + -1] == pnVar2->keyvalue[0])) {
          p[uVar11]->keyvalue[lVar12 + -1] = uVar5;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,pos + uVar11);
          iVar1 = p[lVar8 + -1]->sz;
          break;
        }
      }
    }
    if (iVar1 < 99) {
      lVar12 = (long)iVar9;
      for (lVar6 = (long)iVar1; pnVar2 = p[lVar8 + -1], lVar12 < lVar6; lVar6 = lVar6 + -1) {
        pnVar2->keyvalue[lVar6] = pnVar2->keyvalue[lVar6 + -1];
        (pnVar2->field_0).val[lVar6] = *(long *)((long)pnVar2 + lVar6 * 8 + -8);
      }
      pnVar2->keyvalue[lVar12] = uVar5;
      (pnVar2->field_0).val[lVar12] = lVar7;
      p[lVar8 + -1]->sz = p[lVar8 + -1]->sz + 1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    }
    else {
      lVar12 = (long)iVar9;
      iVar1 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[1])();
      lnk.first = (node *)CONCAT44(extraout_var_01,iVar1);
      uVar4 = 0;
      uVar10 = uVar10 & 0xffffffff;
      if (iVar9 < 1) {
        uVar10 = uVar4;
      }
      for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        pnVar2 = p[lVar8 + -1];
        tmpv[uVar4] = (pnVar2->field_0).val[uVar4];
        tmpk[uVar4] = pnVar2->keyvalue[uVar4];
      }
      tmpv[lVar12] = lVar7;
      for (; tmpk[lVar12] = uVar5, lVar12 < 99; lVar12 = lVar12 + 1) {
        pnVar2 = p[lVar8 + -1];
        tmpv[lVar12 + 1] = (pnVar2->field_0).val[lVar12];
        uVar5 = pnVar2->keyvalue[lVar12];
      }
      pnVar2 = p[lVar8 + -1];
      (lnk.first)->nxt = pnVar2->nxt;
      pnVar2->sz = 0x32;
      uVar5 = 0x32;
      for (lVar7 = 0; lVar12 = (long)(int)uVar5, lVar7 < lVar12; lVar7 = lVar7 + 1) {
        (pnVar2->field_0).val[lVar7] = tmpv[lVar7];
        pnVar2 = p[lVar8 + -1];
        pnVar2->keyvalue[lVar7] = tmpk[lVar7];
        uVar5 = (ulong)(uint)pnVar2->sz;
      }
      pnVar2->nxt = extraout_RDX_00;
      key = (lnk.first)->keyvalue;
      for (; lVar12 < 100; lVar12 = lVar12 + 1) {
        *(long *)((long)lnk.first + lVar12 * 8 + (long)(int)uVar5 * -8) = tmpv[lVar12];
        uVar5 = (ulong)p[lVar8 + -1]->sz;
        *(unsigned_long_long *)((long)lnk.first + lVar12 * 8 + uVar5 * -8 + 0x328) = tmpk[lVar12];
      }
      (lnk.first)->sz = 100 - (int)uVar5;
      lnk.second = extraout_RDX_00;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
      local_68c = this->depth + -2;
      insertnonleaf(this,key,&local_68c,p,pp,pos,lnk.second);
    }
    operator_delete__(p);
    operator_delete__(pp);
    operator_delete__(pos);
    this->siz = this->siz + 1;
  }
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }